

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory_manager_stateless_kernel_1.h
# Opt level: O1

void __thiscall
dlib::
memory_manager_stateless_kernel_1<dlib::binary_search_tree_kernel_2<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<dlib::logger::global_data::auto_flush_container,_std::default_delete<dlib::logger::global_data::auto_flush_container>_>,_dlib::memory_manager_stateless_kernel_1<char>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>::node>
::deallocate(memory_manager_stateless_kernel_1<dlib::binary_search_tree_kernel_2<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<dlib::logger::global_data::auto_flush_container,_std::default_delete<dlib::logger::global_data::auto_flush_container>_>,_dlib::memory_manager_stateless_kernel_1<char>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>::node>
             *this,node *item)

{
  pointer pcVar1;
  
  if (item != (node *)0x0) {
    std::
    unique_ptr<dlib::logger::global_data::auto_flush_container,_std::default_delete<dlib::logger::global_data::auto_flush_container>_>
    ::~unique_ptr(&item->r);
    pcVar1 = (item->d)._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)pcVar1 != &(item->d).field_2) {
      operator_delete(pcVar1);
    }
    operator_delete(item);
    return;
  }
  return;
}

Assistant:

void deallocate (
                T* item
            )
            {
                delete item;
            }